

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

Point3<float> * __thiscall
pbrt::BufferCache<pbrt::Point3<float>_>::LookupOrAdd
          (BufferCache<pbrt::Point3<float>_> *this,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *buf)

{
  bool bVar1;
  Point3<float> *pPVar2;
  size_type sVar3;
  pointer pBVar4;
  __normal_iterator<const_pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  __first;
  unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
  *this_00;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  Point3<float> *ptr;
  iterator iter;
  Buffer lookupBuffer;
  lock_guard<std::mutex> lock;
  unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  value_type *in_stack_ffffffffffffff38;
  Point3<float> *in_stack_ffffffffffffff40;
  __normal_iterator<const_pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  in_stack_ffffffffffffff48;
  Buffer local_80;
  Point3<float> *local_70;
  Point3<float> *local_68;
  Point3<float> *local_60;
  undefined4 local_54;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true> local_50;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true> local_48 [3];
  Buffer local_30;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *local_18;
  Point3<float> *local_8;
  
  in_FS_OFFSET[-0x28] = in_FS_OFFSET[-0x28] + 1;
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
             ,(mutex_type *)in_stack_ffffffffffffff28);
  pPVar2 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::data
                     ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x8bf997
                     );
  sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(local_18);
  Buffer::Buffer(&local_30,pPVar2,sVar3);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x8bf9d6);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator!=(local_48,&local_50);
  if (bVar1) {
    *(long *)(*in_FS_OFFSET + -0x148) = *(long *)(*in_FS_OFFSET + -0x148) + 1;
    sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::capacity
                      (local_18);
    *(long *)(*in_FS_OFFSET + -0x150) = sVar3 * 0xc + *(long *)(*in_FS_OFFSET + -0x150);
    pBVar4 = std::__detail::
             _Node_iterator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true,_true>::operator->
                       ((_Node_iterator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true,_true>
                         *)0x8bfa6c);
    local_8 = pBVar4->ptr;
  }
  else {
    std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(local_18);
    __first._M_current =
         pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Point3<float>>
                   ((polymorphic_allocator<std::byte> *)
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    (size_t)in_stack_ffffffffffffff28);
    local_60 = __first._M_current;
    local_68 = (Point3<float> *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::begin
                         ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                          in_stack_ffffffffffffff28);
    local_70 = (Point3<float> *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
                         ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                          in_stack_ffffffffffffff28);
    std::
    copy<__gnu_cxx::__normal_iterator<pbrt::Point3<float>const*,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>>,pbrt::Point3<float>*>
              (__first,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(local_18);
    *(size_type *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + sVar3 * 0xc;
    this_00 = (unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
               *)(in_RDI + 0x30);
    pPVar2 = local_60;
    sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(local_18);
    Buffer::Buffer(&local_80,pPVar2,sVar3);
    std::
    unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
    ::insert(this_00,in_stack_ffffffffffffff38);
    local_8 = local_60;
  }
  local_54 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x8bfbbc);
  return local_8;
}

Assistant:

const T *LookupOrAdd(const std::vector<T> &buf) {
        ++nBufferCacheLookups;
        std::lock_guard<std::mutex> lock(mutex);
        // Return pointer to data if _buf_ contents is already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        if (auto iter = cache.find(lookupBuffer); iter != cache.end()) {
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.capacity() * sizeof(T);
            return iter->ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        cache.insert(Buffer(ptr, buf.size()));
        return ptr;
    }